

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_window_set_focus(nk_context *ctx,char *name)

{
  int iVar1;
  nk_hash nVar2;
  nk_window *win_00;
  char *in_RSI;
  nk_context *in_RDI;
  nk_window *win;
  nk_hash title_hash;
  int title_len;
  nk_hash hash;
  
  if (in_RDI != (nk_context *)0x0) {
    iVar1 = nk_strlen(in_RSI);
    hash = (nk_hash)((ulong)in_RSI >> 0x20);
    nVar2 = nk_murmur_hash(name,title_len,title_hash);
    win_00 = nk_find_window(in_RDI,hash,(char *)CONCAT44(iVar1,nVar2));
    if ((win_00 != (nk_window *)0x0) && (in_RDI->end != win_00)) {
      nk_remove_window(in_RDI,win_00);
      nk_insert_window(in_RDI,win_00,NK_INSERT_BACK);
    }
    in_RDI->active = win_00;
  }
  return;
}

Assistant:

NK_API void
nk_window_set_focus(struct nk_context *ctx, const char *name)
{
    int title_len;
    nk_hash title_hash;
    struct nk_window *win;
    NK_ASSERT(ctx);
    if (!ctx) return;

    title_len = (int)nk_strlen(name);
    title_hash = nk_murmur_hash(name, (int)title_len, NK_WINDOW_TITLE);
    win = nk_find_window(ctx, title_hash, name);
    if (win && ctx->end != win) {
        nk_remove_window(ctx, win);
        nk_insert_window(ctx, win, NK_INSERT_BACK);
    }
    ctx->active = win;
}